

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int doctest::detail::callTestFunc(funcType f)

{
  ContextState **ppCVar1;
  TestFailureException *anon_var_0;
  uint local_14;
  int res;
  funcType f_local;
  
  (*f)();
  ppCVar1 = getContextState();
  local_14 = (uint)((*ppCVar1)->numFailedAssertionsForCurrentTestcase != 0);
  return local_14;
}

Assistant:

int callTestFunc(funcType f) {
        int res = EXIT_SUCCESS;
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
        try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
            f();
            if(getContextState()->numFailedAssertionsForCurrentTestcase)
                res = EXIT_FAILURE;
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
        } catch(const TestFailureException&) { res = EXIT_FAILURE; } catch(...) {
            DOCTEST_LOG_START();
            logTestCrashed();
            res = EXIT_FAILURE;
        }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
        return res;
    }